

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::BaseRAPass::_markStackArgsToKeep(BaseRAPass *this)

{
  uint uVar1;
  long lVar2;
  RAWorkReg *pRVar3;
  RAStackSlot *this_00;
  bool bVar4;
  Error EVar5;
  uint32_t uVar6;
  RAWorkReg **ppRVar7;
  FuncValue *pFVar8;
  byte bVar9;
  ZoneVector<asmjit::v1_14::RAWorkReg_*> *in_RDI;
  FuncValue *dstArg;
  uint32_t typeSize;
  RAStackSlot *slot;
  FuncValue *srcArg;
  RAWorkReg *workReg;
  uint32_t workId;
  uint32_t numWorkRegs;
  RAWorkRegs *workRegs;
  bool hasSAReg;
  FuncFrame *frame;
  char *in_stack_000002c0;
  int in_stack_000002cc;
  char *in_stack_000002d0;
  int32_t in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  uint in_stack_fffffffffffffed4;
  undefined7 in_stack_fffffffffffffee0;
  byte bVar10;
  uint local_f0;
  
  lVar2 = *(long *)(in_RDI + 0x98);
  bVar4 = Support::test<asmjit::v1_14::FuncAttributes,asmjit::v1_14::FuncAttributes>
                    (*(FuncAttributes *)(lVar2 + 0x2d0),kHasPreservedFP);
  bVar10 = 1;
  if (!bVar4) {
    bVar10 = *(byte *)(lVar2 + 0x2da) <= *(byte *)(lVar2 + 0x2dd) ^ 0xff;
  }
  bVar9 = bVar10 & 1;
  uVar1 = *(uint *)(in_RDI + 0x148);
  local_f0 = 0;
  do {
    if (uVar1 <= local_f0) {
      return 0;
    }
    ppRVar7 = ZoneVector<asmjit::v1_14::RAWorkReg_*>::operator[]
                        (in_RDI,CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    pRVar3 = *ppRVar7;
    bVar4 = Support::test<asmjit::v1_14::RAWorkRegFlags,asmjit::v1_14::RAWorkRegFlags>
                      (*(RAWorkRegFlags *)(pRVar3 + 0x24),kStackArgToStack);
    if (bVar4) {
      if (pRVar3[0x48] == (RAWorkReg)0xff) {
        DebugUtils::assertionFailed(in_stack_000002d0,in_stack_000002cc,in_stack_000002c0);
      }
      pFVar8 = FuncDetail::arg((FuncDetail *)CONCAT17(bVar10,in_stack_fffffffffffffee0),
                               (size_t)in_RDI,
                               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      this_00 = *(RAStackSlot **)(pRVar3 + 0x18);
      if (this_00 == (RAStackSlot *)0x0) {
        EVar5 = DebugUtils::errored(3);
        return EVar5;
      }
      if (((bVar9 != 0) &&
          (bVar4 = Support::test<unsigned_int,unsigned_int>(pFVar8->_data,0x200), bVar4)) &&
         (bVar4 = Support::test<unsigned_int,unsigned_int>(pFVar8->_data,0x400), !bVar4)) {
        in_stack_fffffffffffffed4 =
             (uint)(byte)TypeUtils::_typeData[(ulong)(byte)pFVar8->_data + 0x100];
        uVar6 = RAStackSlot::size(this_00);
        if (in_stack_fffffffffffffed4 == uVar6) {
          RAStackSlot::addFlags(this_00,2);
          goto LAB_0015ff72;
        }
      }
      FuncArgsAssignment::arg
                ((FuncArgsAssignment *)CONCAT17(bVar10,in_stack_fffffffffffffee0),(size_t)in_RDI,
                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      FuncValue::assignStackOffset
                ((FuncValue *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 in_stack_fffffffffffffecc);
    }
LAB_0015ff72:
    local_f0 = local_f0 + 1;
  } while( true );
}

Assistant:

Error BaseRAPass::_markStackArgsToKeep() noexcept {
  FuncFrame& frame = func()->frame();
  bool hasSAReg = frame.hasPreservedFP() || !frame.hasDynamicAlignment();

  RAWorkRegs& workRegs = _workRegs;
  uint32_t numWorkRegs = workRegCount();

  for (uint32_t workId = 0; workId < numWorkRegs; workId++) {
    RAWorkReg* workReg = workRegs[workId];
    if (workReg->hasFlag(RAWorkRegFlags::kStackArgToStack)) {
      ASMJIT_ASSERT(workReg->hasArgIndex());
      const FuncValue& srcArg = _func->detail().arg(workReg->argIndex());

      // If the register doesn't have stack slot then we failed. It doesn't make much sense as it was marked as
      // `kFlagStackArgToStack`, which requires the WorkReg was live-in upon function entry.
      RAStackSlot* slot = workReg->stackSlot();
      if (ASMJIT_UNLIKELY(!slot))
        return DebugUtils::errored(kErrorInvalidState);

      if (hasSAReg && srcArg.isStack() && !srcArg.isIndirect()) {
        uint32_t typeSize = TypeUtils::sizeOf(srcArg.typeId());
        if (typeSize == slot->size()) {
          slot->addFlags(RAStackSlot::kFlagStackArg);
          continue;
        }
      }

      // NOTE: Update StackOffset here so when `_argsAssignment.updateFuncFrame()` is called it will take into
      // consideration moving to stack slots. Without this we may miss some scratch registers later.
      FuncValue& dstArg = _argsAssignment.arg(workReg->argIndex(), workReg->argValueIndex());
      dstArg.assignStackOffset(0);
    }
  }

  return kErrorOk;
}